

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  Options post_opts;
  tuple<HttpWrapper::_Error,_HttpWrapper::_Response> ret;
  Options get_opts;
  undefined1 local_1f8 [16];
  code *local_1e8;
  code *local_1e0;
  HttpWrapper local_1b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b0;
  HttpWrapper local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  undefined1 local_198 [16];
  _Rb_tree_node_base local_188;
  size_t local_168;
  _Rb_tree_node_base local_158;
  size_t local_138;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  local_128 [8];
  _Rb_tree_node_base local_120;
  size_t local_100;
  tuple<HttpWrapper::_Error,_HttpWrapper::_Response> local_f0;
  Options local_a8;
  
  local_a8.params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.params._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.headers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.form._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.form._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.form._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.form._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.form._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.url = "http://0.0.0.0:1234/get";
  local_198._0_8_ = (void *)0x0;
  local_198._8_8_ = 0;
  local_188._M_parent =
       (_Base_ptr)
       std::
       _Function_handler<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/UMCTeam[P]http_wrapper/main.cpp:14:55)>
       ::_M_invoke;
  local_188._0_8_ =
       std::
       _Function_handler<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/UMCTeam[P]http_wrapper/main.cpp:14:55)>
       ::_M_manager;
  local_a8.params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8.form._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.form._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  HttpWrapper::request<(HttpWrapper::Methods)0>(local_1a8,&local_a8,(Handler *)local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0);
  std::_Function_base::~_Function_base((_Function_base *)local_198);
  local_198._0_8_ = (void *)0x0;
  local_198._8_8_ = 0;
  local_188._M_parent =
       (_Base_ptr)
       std::
       _Function_handler<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/UMCTeam[P]http_wrapper/http_wrapper.hpp:198:90)>
       ::_M_invoke;
  local_188._0_8_ =
       std::
       _Function_handler<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/UMCTeam[P]http_wrapper/http_wrapper.hpp:198:90)>
       ::_M_manager;
  HttpWrapper::request<(HttpWrapper::Methods)0>
            ((HttpWrapper *)local_1f8,&local_a8,(Handler *)local_198);
  std::future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_>::get
            (&local_f0,(future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_> *)local_1f8
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8));
  std::_Function_base::~_Function_base((_Function_base *)local_198);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_f0);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_188._M_left = &local_188;
  local_188._0_8_ = local_188._0_8_ & 0xffffffff00000000;
  local_188._M_parent = (_Base_ptr)0x0;
  local_168 = 0;
  local_158._M_left = &local_158;
  local_158._M_color = _S_red;
  local_158._M_parent = (_Base_ptr)0x0;
  local_138 = 0;
  local_120._M_left = &local_120;
  local_120._M_color = _S_red;
  local_120._M_parent = (_Base_ptr)0x0;
  local_100 = 0;
  local_198._0_8_ = "http://0.0.0.0:1234/post";
  local_188._M_right = local_188._M_left;
  local_158._M_right = local_158._M_left;
  local_120._M_right = local_120._M_left;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1f8,(char (*) [8])"message",(char (*) [6])"hello");
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            (local_128,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1f8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_1f8);
  local_1f8._0_8_ = (element_type *)0x0;
  local_1f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1e0 = std::
              _Function_handler<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/UMCTeam[P]http_wrapper/main.cpp:31:56)>
              ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/UMCTeam[P]http_wrapper/main.cpp:31:56)>
              ::_M_manager;
  HttpWrapper::request<(HttpWrapper::Methods)1>(local_1b8,(Options *)local_198,(Handler *)local_1f8)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0);
  std::_Function_base::~_Function_base((_Function_base *)local_1f8);
  do {
    local_1f8._0_8_ = (element_type *)0x1;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)local_1f8);
  } while( true );
}

Assistant:

int main() {
    //Get请求
    HttpWrapper::Options get_opts;
    get_opts.url = "http://0.0.0.0:1234/get";

    //异步操作
    HttpWrapper::request<HttpWrapper::GET>(get_opts,  [=](const HttpWrapper::Error& error, const HttpWrapper::Response& response) {

        if (!error) {
            cout << response.data << endl;
        }

    });

    //同步操作
    auto ret = HttpWrapper::request<HttpWrapper::GET>(get_opts).get();
    cout << std::get<1>(ret).data << endl;

    //Post 请求
    HttpWrapper::Options post_opts;
    post_opts.url = "http://0.0.0.0:1234/post";
    post_opts.form.insert(pair<string, string>("message", "hello"));

    HttpWrapper::request<HttpWrapper::POST>(post_opts, [=](const HttpWrapper::Error& error, const HttpWrapper::Response& response) {
        cout << response.data << endl;
    });

    while (1) {
        std::this_thread::sleep_for(chrono::seconds(1));
    }

    return 0;
}